

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
AnalyzeClassDefinition
          (ExpressionContext *ctx,SynClassDefinition *syntax,TypeGenericClassProto *proto,
          IntrusiveList<TypeHandle> generics)

{
  ScopeData **ppSVar1;
  uint uniqueId;
  long lVar2;
  ExprBase *pEVar3;
  IntrusiveList<MatchData> generics_00;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint offset;
  char *pcVar7;
  TypeClass *pTVar8;
  ScopeData *pSVar9;
  TypeBase *pTVar10;
  undefined4 extraout_var;
  MatchData *pMVar11;
  AliasData *pAVar12;
  TypeClass *baseClass;
  undefined4 extraout_var_02;
  ExprClassDefinition *classDefinition;
  undefined4 extraout_var_04;
  SynIdentifier *pSVar13;
  VariableData *this;
  MemberHandle *node;
  undefined4 extraout_var_08;
  MatchData *node_00;
  ConstantData *node_01;
  undefined4 extraout_var_11;
  int iVar14;
  TypeHandle *pTVar15;
  Node *pNVar16;
  TypeHandle *pTVar17;
  char *pcVar18;
  bool bVar19;
  uint uVar20;
  ulong uVar21;
  SynIdentifier *pSVar22;
  ConstantData *pCVar23;
  InplaceStr IVar24;
  IntrusiveList<MatchData> actualGenerics;
  TraceScope traceScope;
  IntrusiveList<MatchData> local_a8;
  TraceScope local_90;
  SynIdentifier local_80;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  
  IVar24.end = generics.tail;
  pTVar15 = generics.head;
  IVar24.begin = (syntax->name->name).end;
  anon_unknown.dwarf_1117a3::CheckTypeConflict
            ((anon_unknown_dwarf_1117a3 *)ctx,(ExpressionContext *)syntax,
             (SynBase *)(syntax->name->name).begin,IVar24);
  IVar24 = GetTypeNameInScope(ctx,ctx->scope,syntax->name->name);
  pcVar7 = IVar24.begin;
  if ((AnalyzeClassDefinition(ExpressionContext&,SynClassDefinition*,TypeGenericClassProto*,IntrusiveList<TypeHandle>)
       ::token == '\0') &&
     (iVar5 = __cxa_guard_acquire(&AnalyzeClassDefinition(ExpressionContext&,SynClassDefinition*,TypeGenericClassProto*,IntrusiveList<TypeHandle>)
                                   ::token), iVar5 != 0)) {
    AnalyzeClassDefinition::token = NULLC::TraceGetToken("analyze","AnalyzeClassDefinition");
    __cxa_guard_release(&AnalyzeClassDefinition(ExpressionContext&,SynClassDefinition*,TypeGenericClassProto*,IntrusiveList<TypeHandle>)
                         ::token);
  }
  NULLC::TraceScope::TraceScope(&local_90,AnalyzeClassDefinition::token);
  lVar4 = NULLC::traceContext;
  uVar21 = (long)IVar24.end - (long)pcVar7;
  iVar5 = (int)uVar21;
  if (iVar5 != 0) {
    uVar20 = iVar5 + 1;
    uVar6 = *(uint *)(NULLC::traceContext + 0x264);
    if ((uVar6 <= *(int *)(NULLC::traceContext + 0x260) + uVar20) ||
       (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
      NULLC::TraceDump();
      uVar6 = *(uint *)(lVar4 + 0x264);
    }
    if (uVar6 <= uVar20) {
      __assert_fail("count + 1 < context.labels.max",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                    ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
    }
    uVar6 = *(uint *)(lVar4 + 0x260);
    memcpy((void *)((ulong)uVar6 + *(long *)(lVar4 + 0x268)),pcVar7,uVar21 & 0xffffffff);
    *(undefined1 *)(*(long *)(lVar4 + 0x268) + (ulong)(uint)(*(int *)(lVar4 + 0x260) + iVar5)) = 0;
    *(int *)(lVar4 + 0x260) = *(int *)(lVar4 + 0x260) + uVar20;
    lVar2 = *(long *)(lVar4 + 0x278);
    uVar20 = *(uint *)(lVar4 + 0x270);
    *(uint *)(lVar4 + 0x270) = uVar20 + 1;
    *(uint *)(lVar2 + (ulong)uVar20 * 8) = uVar6 * 4 + 2;
    *(undefined4 *)(lVar2 + 4 + (ulong)uVar20 * 8) = 0;
  }
  ppSVar1 = &ctx->scope;
  if ((proto == (TypeGenericClassProto *)0x0) &&
     (pSVar13 = (syntax->aliases).head, pSVar13 != (SynIdentifier *)0x0)) {
    do {
      uVar6 = NULLC::GetStringHash((pSVar13->name).begin,(pSVar13->name).end);
      pTVar10 = anon_unknown.dwarf_1117a3::LookupTypeByName
                          ((anon_unknown_dwarf_1117a3 *)ctx->scope,
                           (ExpressionContext *)ctx->lookupLocation,uVar6);
      if (pTVar10 != (TypeBase *)0x0) {
        anon_unknown.dwarf_1117a3::Stop
                  (ctx,&pSVar13->super_SynBase,
                   "ERROR: there is already a type or an alias with the same name");
      }
      pSVar22 = (syntax->aliases).head;
      if (pSVar22 != pSVar13 && pSVar22 != (SynIdentifier *)0x0) {
        do {
          bVar19 = InplaceStr::operator==(&pSVar22->name,&pSVar13->name);
          if (bVar19) {
            anon_unknown.dwarf_1117a3::Stop
                      (ctx,&pSVar13->super_SynBase,
                       "ERROR: there is already a type or an alias with the same name");
          }
          pSVar22 = (SynIdentifier *)(pSVar22->super_SynBase).next;
        } while (((pSVar22 != (SynIdentifier *)0x0) && ((pSVar22->super_SynBase).typeID == 4)) &&
                (pSVar22 != pSVar13));
      }
      pSVar13 = (SynIdentifier *)(pSVar13->super_SynBase).next;
    } while ((pSVar13 != (SynIdentifier *)0x0) && ((pSVar13->super_SynBase).typeID == 4));
    uVar6 = NULLC::GetStringHash(pcVar7,IVar24.end);
    pTVar10 = anon_unknown.dwarf_1117a3::LookupTypeByName
                        ((anon_unknown_dwarf_1117a3 *)ctx->scope,
                         (ExpressionContext *)ctx->lookupLocation,uVar6);
    if (pTVar10 != (TypeBase *)0x0) {
      pcVar18 = "ERROR: \'%.*s\' is being redefined";
      if (pTVar10->typeID == 0x18) {
        pcVar18 = "ERROR: type \'%.*s\' was forward declared as a non-generic type";
      }
      anon_unknown.dwarf_1117a3::Stop(ctx,&syntax->super_SynBase,pcVar18,uVar21 & 0xffffffff,pcVar7)
      ;
    }
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0xd8);
    pTVar8 = (TypeClass *)CONCAT44(extraout_var,iVar5);
    local_80.super_SynBase.begin = (syntax->name->super_SynBase).begin;
    local_80.super_SynBase.end = (syntax->name->super_SynBase).end;
    local_80.super_SynBase.typeID = 4;
    if (local_80.super_SynBase.begin == (Lexeme *)0x0) {
      local_80.super_SynBase.pos.begin = (char *)0x0;
    }
    else {
      local_80.super_SynBase.pos.begin = (local_80.super_SynBase.begin)->pos;
    }
    if (local_80.super_SynBase.end == (Lexeme *)0x0) {
      local_80.super_SynBase.pos.end = (char *)0x0;
    }
    else {
      local_80.super_SynBase.pos.end =
           (local_80.super_SynBase.end)->pos + (local_80.super_SynBase.end)->length;
    }
    if (local_80.super_SynBase.pos.end < local_80.super_SynBase.pos.begin) {
LAB_001e4ae9:
      local_80.super_SynBase.typeID = 4;
      __assert_fail("strEnd >= strBegin",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/StrAlgo.h"
                    ,0x28,"InplaceStr::InplaceStr(const char *, const char *)");
    }
    local_80.super_SynBase.next = (SynBase *)0x0;
    local_80.super_SynBase.listed = false;
    local_80.super_SynBase.isInternal = false;
    local_80.super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
    local_80.name = IVar24;
    TypeGenericClassProto::TypeGenericClassProto
              ((TypeGenericClassProto *)pTVar8,&local_80,&syntax->super_SynBase,*ppSVar1,syntax);
    ExpressionContext::AddType(ctx,(TypeBase *)pTVar8);
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    classDefinition = (ExprClassDefinition *)CONCAT44(extraout_var_11,iVar5);
    pTVar10 = ctx->typeVoid;
    (classDefinition->super_ExprBase).typeID = 0x2c;
    (classDefinition->super_ExprBase).source = &syntax->super_SynBase;
    (classDefinition->super_ExprBase).type = pTVar10;
    (classDefinition->super_ExprBase).next = (ExprBase *)0x0;
    (classDefinition->super_ExprBase).listed = false;
    (classDefinition->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6e48;
    classDefinition->classType = pTVar8;
  }
  else {
    iVar5 = 0;
    iVar14 = 0;
    if (pTVar15 != (TypeHandle *)0x0) {
      iVar14 = 0;
      pTVar17 = pTVar15;
      do {
        iVar14 = iVar14 + 1;
        pTVar17 = pTVar17->next;
      } while (pTVar17 != (TypeHandle *)0x0);
    }
    pSVar13 = (syntax->aliases).head;
    if (pSVar13 != (SynIdentifier *)0x0) {
      iVar5 = 0;
      do {
        iVar5 = iVar5 + 1;
        pSVar13 = (SynIdentifier *)(pSVar13->super_SynBase).next;
      } while (pSVar13 != (SynIdentifier *)0x0);
    }
    if (iVar14 != iVar5) {
      __assert_fail("generics.size() == syntax->aliases.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x29ba,
                    "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                   );
    }
    if (pTVar15 != (TypeHandle *)0x0) {
      IVar24 = GetGenericClassTypeName(ctx,&proto->super_TypeBase,generics);
      uVar21 = (ulong)(uint)((int)IVar24.end - (int)IVar24.begin);
    }
    pcVar7 = IVar24.end;
    pcVar18 = IVar24.begin;
    if (0x2000 < (uint)uVar21) {
      anon_unknown.dwarf_1117a3::Stop
                (ctx,&syntax->super_SynBase,
                 "ERROR: generated type name exceeds maximum type length \'%d\'",0x2000);
    }
    uVar6 = NULLC::GetStringHash(pcVar18,pcVar7);
    pTVar8 = (TypeClass *)
             anon_unknown.dwarf_1117a3::LookupTypeByName
                       ((anon_unknown_dwarf_1117a3 *)ctx->scope,
                        (ExpressionContext *)ctx->lookupLocation,uVar6);
    if (pTVar8 != (TypeClass *)0x0) {
      if (((pTVar8->super_TypeStruct).super_TypeBase.typeID != 0x18) ||
         (pSVar9 = (ScopeData *)ppSVar1, pTVar8->completed != false)) {
        anon_unknown.dwarf_1117a3::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
                   uVar21 & 0xffffffff,pcVar18);
      }
      while (pSVar9 = pSVar9->scope, pSVar9 != (ScopeData *)0x0) {
        if ((TypeClass *)pSVar9->ownerType == pTVar8) {
          anon_unknown.dwarf_1117a3::Stop
                    (ctx,&syntax->super_SynBase,"ERROR: \'%.*s\' is being redefined",
                     uVar21 & 0xffffffff,pcVar18);
        }
      }
    }
    if (pTVar15 != (TypeHandle *)0x0) {
      uVar6 = NULLC::GetStringHash(pcVar18,pcVar7);
      for (pNVar16 = (ctx->genericTypeMap).entries[uVar6 & 0x3ff]; pNVar16 != (Node *)0x0;
          pNVar16 = pNVar16->next) {
        if (pNVar16->hash == uVar6) {
          __assert_fail("ctx.genericTypeMap.find(className.hash()) == NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x29d7,
                        "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                       );
        }
      }
    }
    if (syntax->align == (SynAlign *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = AnalyzeAlignment(ctx,syntax->align);
    }
    local_a8.head = (MatchData *)0x0;
    local_a8.tail = (MatchData *)0x0;
    pSVar13 = (syntax->aliases).head;
    if (pSVar13 != (SynIdentifier *)0x0 && pTVar15 != (TypeHandle *)0x0) {
      pTVar17 = pTVar15;
      do {
        if ((pTVar17->type != (TypeBase *)0x0) && (pTVar17->type->typeID == 0)) {
          __assert_fail("!isType<TypeError>(currType->type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x29e4,
                        "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                       );
        }
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pMVar11 = (MatchData *)CONCAT44(extraout_var_00,iVar5);
        pTVar10 = pTVar17->type;
        pMVar11->name = pSVar13;
        pMVar11->type = pTVar10;
        pMVar11->next = (MatchData *)0x0;
        pMVar11->listed = false;
        IntrusiveList<MatchData>::push_back(&local_a8,pMVar11);
        pSVar13 = (SynIdentifier *)(pSVar13->super_SynBase).next;
      } while (((pSVar13 != (SynIdentifier *)0x0) && ((pSVar13->super_SynBase).typeID == 4)) &&
              (pTVar17 = pTVar17->next, pTVar17 != (TypeHandle *)0x0));
    }
    if (syntax->baseClass == (SynBase *)0x0) {
      baseClass = (TypeClass *)0x0;
    }
    else {
      ExpressionContext::PushTemporaryScope(ctx);
      for (pMVar11 = local_a8.head; pMVar11 != (MatchData *)0x0; pMVar11 = pMVar11->next) {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
        pAVar12 = (AliasData *)CONCAT44(extraout_var_01,iVar5);
        pSVar9 = ctx->scope;
        pSVar13 = pMVar11->name;
        pTVar10 = pMVar11->type;
        uVar20 = ctx->uniqueAliasId;
        ctx->uniqueAliasId = uVar20 + 1;
        pAVar12->source = &syntax->super_SynBase;
        pAVar12->scope = pSVar9;
        pAVar12->type = pTVar10;
        pAVar12->name = pSVar13;
        pAVar12->uniqueId = uVar20;
        pAVar12->importModule = (ModuleData *)0x0;
        uVar20 = NULLC::GetStringHash((pSVar13->name).begin,(pSVar13->name).end);
        pAVar12->nameHash = uVar20;
        ExpressionContext::AddAlias(ctx,pAVar12);
      }
      baseClass = (TypeClass *)AnalyzeType(ctx,syntax->baseClass,true,(bool *)0x0);
      ExpressionContext::PopScope(ctx,SCOPE_TEMPORARY,true);
      if (baseClass == (TypeClass *)0x0) {
LAB_001e43e7:
        anon_unknown.dwarf_1117a3::Stop
                  (ctx,&syntax->super_SynBase,"ERROR: type \'%.*s\' is not extendable",
                   (ulong)(uint)(*(int *)&(baseClass->super_TypeStruct).super_TypeBase.name.end -
                                (int)(baseClass->super_TypeStruct).super_TypeBase.name.begin));
      }
      uVar20 = (baseClass->super_TypeStruct).super_TypeBase.typeID;
      if (uVar20 == 0) {
        baseClass = (TypeClass *)0x0;
      }
      else if ((uVar20 != 0x18) || (baseClass->extendable == false)) goto LAB_001e43e7;
    }
    bVar19 = (bool)(baseClass != (TypeClass *)0x0 | syntax->extendable);
    if (pTVar8 == (TypeClass *)0x0) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x180);
      pTVar8 = (TypeClass *)CONCAT44(extraout_var_02,iVar5);
      local_80.super_SynBase.begin = (syntax->name->super_SynBase).begin;
      local_80.super_SynBase.end = (syntax->name->super_SynBase).end;
      local_80.super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_003e61d8;
      local_80.super_SynBase.typeID = 4;
      if (local_80.super_SynBase.begin == (Lexeme *)0x0) {
        local_80.super_SynBase.pos.begin = (char *)0x0;
      }
      else {
        local_80.super_SynBase.pos.begin = (local_80.super_SynBase.begin)->pos;
      }
      if (local_80.super_SynBase.end == (Lexeme *)0x0) {
        local_80.super_SynBase.pos.end = (char *)0x0;
      }
      else {
        local_80.super_SynBase.pos.end =
             (local_80.super_SynBase.end)->pos + (local_80.super_SynBase.end)->length;
      }
      if (local_80.super_SynBase.pos.end < local_80.super_SynBase.pos.begin) goto LAB_001e4ae9;
      local_80.super_SynBase.next = (SynBase *)0x0;
      local_80.super_SynBase.listed = false;
      local_80.super_SynBase.isInternal = false;
      local_80.super_SynBase._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
      generics_00.tail._0_4_ = (int)local_a8.tail;
      generics_00.head = local_a8.head;
      generics_00.tail._4_4_ = (int)((ulong)local_a8.tail >> 0x20);
      local_80.name = IVar24;
      TypeClass::TypeClass
                (pTVar8,ctx->allocator,&local_80,&syntax->super_SynBase,*ppSVar1,proto,generics_00,
                 bVar19,baseClass);
      ExpressionContext::AddType(ctx,(TypeBase *)pTVar8);
    }
    else {
      pTVar8->extendable = bVar19;
      pTVar8->baseClass = baseClass;
    }
    if (pTVar15 != (TypeHandle *)0x0) {
      uVar20 = NULLC::GetStringHash(pcVar18,pcVar7);
      HashMap<TypeClass_*>::insert(&ctx->genericTypeMap,uVar20,pTVar8);
    }
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
    classDefinition = (ExprClassDefinition *)CONCAT44(extraout_var_03,iVar5);
    pTVar10 = ctx->typeVoid;
    (classDefinition->super_ExprBase).typeID = 0x2d;
    (classDefinition->super_ExprBase).source = &syntax->super_SynBase;
    (classDefinition->super_ExprBase).type = pTVar10;
    (classDefinition->super_ExprBase).next = (ExprBase *)0x0;
    (classDefinition->super_ExprBase).listed = false;
    (classDefinition->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6e80;
    classDefinition->classType = pTVar8;
    (classDefinition->aliases).head = (ExprAliasDefinition *)0x0;
    (classDefinition->aliases).tail = (ExprAliasDefinition *)0x0;
    (classDefinition->functions).head = (ExprBase *)0x0;
    (classDefinition->functions).tail = (ExprBase *)0x0;
    ExpressionContext::PushScope(ctx,(TypeBase *)pTVar8);
    (pTVar8->super_TypeStruct).typeScope = *ppSVar1;
    for (pMVar11 = (pTVar8->generics).head; pMVar11 != (MatchData *)0x0; pMVar11 = pMVar11->next) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
      pAVar12 = (AliasData *)CONCAT44(extraout_var_04,iVar5);
      pSVar9 = ctx->scope;
      pSVar13 = pMVar11->name;
      pTVar10 = pMVar11->type;
      uVar20 = ctx->uniqueAliasId;
      ctx->uniqueAliasId = uVar20 + 1;
      pAVar12->source = &syntax->super_SynBase;
      pAVar12->scope = pSVar9;
      pAVar12->type = pTVar10;
      pAVar12->name = pSVar13;
      pAVar12->uniqueId = uVar20;
      pAVar12->importModule = (ModuleData *)0x0;
      uVar20 = NULLC::GetStringHash((pSVar13->name).begin,(pSVar13->name).end);
      pAVar12->nameHash = uVar20;
      ExpressionContext::AddAlias(ctx,pAVar12);
    }
    if (bVar19 != false) {
      offset = anon_unknown.dwarf_1117a3::AllocateVariableInScope
                         (ctx,&syntax->super_SynBase,ctx->typeTypeID->alignment,ctx->typeTypeID);
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
      pSVar13 = (SynIdentifier *)CONCAT44(extraout_var_05,iVar5);
      (pSVar13->super_SynBase).typeID = 4;
      (pSVar13->super_SynBase).begin = (Lexeme *)0x0;
      (pSVar13->super_SynBase).end = (Lexeme *)0x0;
      (pSVar13->super_SynBase).pos.begin = (char *)0x0;
      (pSVar13->super_SynBase).pos.end = (char *)0x0;
      *(undefined8 *)((long)&(pSVar13->super_SynBase).pos.end + 2) = 0;
      *(undefined8 *)((long)&(pSVar13->super_SynBase).next + 2) = 0;
      (pSVar13->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_003e6190;
      (pSVar13->name).begin = "$typeid";
      (pSVar13->name).end = "";
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
      this = (VariableData *)CONCAT44(extraout_var_06,iVar5);
      uVar20 = ctx->typeTypeID->alignment;
      uniqueId = ctx->uniqueVariableId;
      ctx->uniqueVariableId = uniqueId + 1;
      VariableData::VariableData
                (this,ctx->allocator,&syntax->super_SynBase,ctx->scope,uVar20,ctx->typeTypeID,
                 pSVar13,offset,uniqueId);
      ExpressionContext::AddVariable(ctx,this,false);
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x28);
      node = (MemberHandle *)CONCAT44(extraout_var_07,iVar5);
      node->source = (SynBase *)0x0;
      node->variable = this;
      node->initializer = (SynBase *)0x0;
      node->next = (MemberHandle *)0x0;
      node->listed = false;
      IntrusiveList<MemberHandle>::push_back(&(pTVar8->super_TypeStruct).members,node);
      if (baseClass != (TypeClass *)0x0) {
        (pTVar8->super_TypeStruct).super_TypeBase.alignment =
             (baseClass->super_TypeStruct).super_TypeBase.alignment;
        pMVar11 = (baseClass->aliases).head;
        if (pMVar11 != (MatchData *)0x0) {
          do {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
            pAVar12 = (AliasData *)CONCAT44(extraout_var_08,iVar5);
            pSVar9 = ctx->scope;
            pSVar13 = pMVar11->name;
            pTVar10 = pMVar11->type;
            uVar20 = ctx->uniqueAliasId;
            ctx->uniqueAliasId = uVar20 + 1;
            pAVar12->source = &syntax->super_SynBase;
            pAVar12->scope = pSVar9;
            pAVar12->type = pTVar10;
            pAVar12->name = pSVar13;
            pAVar12->uniqueId = uVar20;
            pAVar12->importModule = (ModuleData *)0x0;
            uVar20 = NULLC::GetStringHash((pSVar13->name).begin,(pSVar13->name).end);
            pAVar12->nameHash = uVar20;
            ExpressionContext::AddAlias(ctx,pAVar12);
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            node_00 = (MatchData *)CONCAT44(extraout_var_09,iVar5);
            pSVar13 = pMVar11->name;
            pTVar10 = pMVar11->type;
            node_00->name = pSVar13;
            node_00->type = pTVar10;
            node_00->next = (MatchData *)0x0;
            node_00->listed = false;
            if (pSVar13 == (SynIdentifier *)0x0) {
              __assert_fail("name",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                            ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
            }
            IntrusiveList<MatchData>::push_back(&pTVar8->aliases,node_00);
            pMVar11 = pMVar11->next;
          } while (pMVar11 != (MatchData *)0x0);
        }
        AddBaseClassMemberVariables(ctx,&syntax->super_SynBase,baseClass,pTVar8);
        pCVar23 = (baseClass->super_TypeStruct).constants.head;
        if (pCVar23 != (ConstantData *)0x0) {
          do {
            iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
            node_01 = (ConstantData *)CONCAT44(extraout_var_10,iVar5);
            pEVar3 = pCVar23->value;
            node_01->name = pCVar23->name;
            node_01->value = pEVar3;
            node_01->next = (ConstantData *)0x0;
            node_01->listed = false;
            IntrusiveList<ConstantData>::push_back(&(pTVar8->super_TypeStruct).constants,node_01);
            pCVar23 = pCVar23->next;
          } while (pCVar23 != (ConstantData *)0x0);
        }
        anon_unknown.dwarf_1117a3::FinalizeAlignment(&pTVar8->super_TypeStruct);
        if ((pTVar8->super_TypeStruct).super_TypeBase.size !=
            (baseClass->super_TypeStruct).super_TypeBase.size) {
          __assert_fail("classType->size == baseClass->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x2a43,
                        "ExprBase *AnalyzeClassDefinition(ExpressionContext &, SynClassDefinition *, TypeGenericClassProto *, IntrusiveList<TypeHandle>)"
                       );
        }
      }
    }
    if (syntax->align != (SynAlign *)0x0) {
      (pTVar8->super_TypeStruct).super_TypeBase.alignment = uVar6;
    }
    AnalyzeClassElements(ctx,classDefinition,syntax->elements);
    ExpressionContext::PopScope(ctx,SCOPE_TYPE,true);
  }
  NULLC::TraceScope::~TraceScope(&local_90);
  return &classDefinition->super_ExprBase;
}

Assistant:

ExprBase* AnalyzeClassDefinition(ExpressionContext &ctx, SynClassDefinition *syntax, TypeGenericClassProto *proto, IntrusiveList<TypeHandle> generics)
{
	CheckTypeConflict(ctx, syntax, syntax->name->name);

	InplaceStr typeName = GetTypeNameInScope(ctx, ctx.scope, syntax->name->name);

	TRACE_SCOPE("analyze", "AnalyzeClassDefinition");
	TRACE_LABEL2(typeName.begin, typeName.end);

	if(!proto && !syntax->aliases.empty())
	{
		for(SynIdentifier *curr = syntax->aliases.head; curr; curr = getType<SynIdentifier>(curr->next))
		{
			if(LookupTypeByName(ctx, curr->name.hash()))
				Stop(ctx, curr, "ERROR: there is already a type or an alias with the same name");

			for(SynIdentifier *prev = syntax->aliases.head; prev && prev != curr; prev = getType<SynIdentifier>(prev->next))
			{
				if(prev->name == curr->name)
					Stop(ctx, curr, "ERROR: there is already a type or an alias with the same name");
			}
		}

		if(TypeBase *type = LookupTypeByName(ctx, typeName.hash()))
		{
			TypeClass *originalDefinition = getType<TypeClass>(type);

			if(originalDefinition)
				Stop(ctx, syntax, "ERROR: type '%.*s' was forward declared as a non-generic type", FMT_ISTR(typeName));
			else
				Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(typeName));
		}

		TypeGenericClassProto *genericProtoType = new (ctx.get<TypeGenericClassProto>()) TypeGenericClassProto(SynIdentifier(syntax->name, typeName), syntax, ctx.scope, syntax);

		ctx.AddType(genericProtoType);

		return new (ctx.get<ExprGenericClassPrototype>()) ExprGenericClassPrototype(syntax, ctx.typeVoid, genericProtoType);
	}

	assert(generics.size() == syntax->aliases.size());

	InplaceStr className = generics.empty() ? typeName : GetGenericClassTypeName(ctx, proto, generics);

	if(className.length() > NULLC_MAX_TYPE_NAME_LENGTH)
		Stop(ctx, syntax, "ERROR: generated type name exceeds maximum type length '%d'", NULLC_MAX_TYPE_NAME_LENGTH);

	TypeClass *originalDefinition = NULL;

	if(TypeBase *type = LookupTypeByName(ctx, className.hash()))
	{
		originalDefinition = getType<TypeClass>(type);

		if(!originalDefinition)
			Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(className));

		if(originalDefinition->completed)
			Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(className));

		for(ScopeData *scope = ctx.scope; scope; scope = scope->scope)
		{
			if(scope->ownerType == originalDefinition)
				Stop(ctx, syntax, "ERROR: '%.*s' is being redefined", FMT_ISTR(className));
		}
	}

	if(!generics.empty())
	{
		// Check if type already exists
		assert(ctx.genericTypeMap.find(className.hash()) == NULL);
	}

	unsigned alignment = syntax->align ? AnalyzeAlignment(ctx, syntax->align) : 0;

	IntrusiveList<MatchData> actualGenerics;

	{
		TypeHandle *currType = generics.head;
		SynIdentifier *currName = syntax->aliases.head;

		while(currType && currName)
		{
			assert(!isType<TypeError>(currType->type));

			actualGenerics.push_back(new (ctx.get<MatchData>()) MatchData(currName, currType->type));

			currType = currType->next;
			currName = getType<SynIdentifier>(currName->next);
		}
	}

	TypeClass *baseClass = NULL;

	if(syntax->baseClass)
	{
		ctx.PushTemporaryScope();

		for(MatchData *el = actualGenerics.head; el; el = el->next)
			ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

		TypeBase *type = AnalyzeType(ctx, syntax->baseClass);

		ctx.PopScope(SCOPE_TEMPORARY);

		if(!isType<TypeError>(type))
		{
			baseClass = getType<TypeClass>(type);

			if(!baseClass || !baseClass->extendable)
				Stop(ctx, syntax, "ERROR: type '%.*s' is not extendable", FMT_ISTR(type->name));
		}
	}
	
	bool extendable = syntax->extendable || baseClass;

	TypeClass *classType = NULL;
	
	if(originalDefinition)
	{
		classType = originalDefinition;

		classType->extendable = extendable;
		classType->baseClass = baseClass;
	}
	else
	{
		classType = new (ctx.get<TypeClass>()) TypeClass(ctx.allocator, SynIdentifier(syntax->name, className), syntax, ctx.scope, proto, actualGenerics, extendable, baseClass);

		ctx.AddType(classType);
	}

	if(!generics.empty())
		ctx.genericTypeMap.insert(className.hash(), classType);

	ExprClassDefinition *classDefinition = new (ctx.get<ExprClassDefinition>()) ExprClassDefinition(syntax, ctx.typeVoid, classType);

	ctx.PushScope(classType);

	classType->typeScope = ctx.scope;

	for(MatchData *el = classType->generics.head; el; el = el->next)
		ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

	// Base class adds a typeid member
	if(extendable)
	{
		unsigned offset = AllocateVariableInScope(ctx, syntax, ctx.typeTypeID->alignment, ctx.typeTypeID);

		SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr("$typeid"));

		VariableData *member = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, ctx.typeTypeID->alignment, ctx.typeTypeID, nameIdentifier, offset, ctx.uniqueVariableId++);

		ctx.AddVariable(member, false);

		classType->members.push_back(new (ctx.get<MemberHandle>()) MemberHandle(NULL, member, NULL));
	}

	if(baseClass)
	{
		// Use base class alignment at ths point to match member locations
		classType->alignment = baseClass->alignment;

		// Add members of base class
		for(MatchData *el = baseClass->aliases.head; el; el = el->next)
		{
			ctx.AddAlias(new (ctx.get<AliasData>()) AliasData(syntax, ctx.scope, el->type, el->name, ctx.uniqueAliasId++));

			classType->aliases.push_back(new (ctx.get<MatchData>()) MatchData(el->name, el->type));
		}

		AddBaseClassMemberVariables(ctx, syntax, baseClass, classType);

		for(ConstantData *el = baseClass->constants.head; el; el = el->next)
			classType->constants.push_back(new (ctx.get<ConstantData>()) ConstantData(el->name, el->value));

		FinalizeAlignment(classType);

		assert(classType->size == baseClass->size);
	}

	if(syntax->align)
		classType->alignment = alignment;

	AnalyzeClassElements(ctx, classDefinition, syntax->elements);

	ctx.PopScope(SCOPE_TYPE);

	return classDefinition;
}